

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O1

int hash_block_size_to_index(int block_size)

{
  if (block_size < 0x20) {
    if (block_size == 4) {
      return 0;
    }
    if (block_size == 8) {
      return 1;
    }
    if (block_size == 0x10) {
      return 2;
    }
  }
  else {
    if (block_size == 0x20) {
      return 3;
    }
    if (block_size == 0x40) {
      return 4;
    }
    if (block_size == 0x80) {
      return 5;
    }
  }
  return -1;
}

Assistant:

static int hash_block_size_to_index(int block_size) {
  switch (block_size) {
    case 4: return 0;
    case 8: return 1;
    case 16: return 2;
    case 32: return 3;
    case 64: return 4;
    case 128: return 5;
    default: return -1;
  }
}